

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * pack15_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in - base;
  *out = (in[1] - base) * 0x8000 | *out;
  *out = (in[2] - base) * 0x40000000 | *out;
  puVar1 = out + 1;
  *puVar1 = in[2] - base >> 2;
  *puVar1 = (in[3] - base) * 0x2000 | *puVar1;
  *puVar1 = (in[4] - base) * 0x10000000 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[4] - base >> 4;
  *puVar1 = (in[5] - base) * 0x800 | *puVar1;
  *puVar1 = (in[6] - base) * 0x4000000 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[6] - base >> 6;
  *puVar1 = (in[7] - base) * 0x200 | *puVar1;
  return out + 4;
}

Assistant:

uint32_t * pack15_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  15 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  30 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 15  -  13 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  13 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  28 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 15  -  11 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  11 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  26 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 15  -  9 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  9 ;
    ++in;

    return out + 1;
}